

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void idr_extend_identifier(idrent *wnp,int numsize,int nullsize)

{
  long lVar1;
  int iVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int wnp_ext_off;
  uchar *p;
  
  iVar2 = *(int *)(*(long *)(in_RDI + 0x28) + 0xb0);
  if (*(int *)(in_RDI + 0x34) + in_ESI != iVar2) {
    lVar1 = *(long *)(*(long *)(in_RDI + 0x28) + 0xa8);
    memmove((void *)(lVar1 + *(int *)(in_RDI + 0x34) + (long)in_ESI),(void *)(lVar1 + iVar2),
            (long)(*(int *)(*(long *)(in_RDI + 0x28) + 0xb4) + in_EDX));
    iVar2 = *(int *)(in_RDI + 0x34) + in_ESI;
    *(int *)(*(long *)(in_RDI + 0x28) + 0xb0) = iVar2;
    *(int *)(*(long *)(in_RDI + 0x28) + 0xb8) = iVar2 + *(int *)(*(long *)(in_RDI + 0x28) + 0xb4);
  }
  return;
}

Assistant:

static void
idr_extend_identifier(struct idrent *wnp, int numsize, int nullsize)
{
	unsigned char *p;
	int wnp_ext_off;

	wnp_ext_off = wnp->isoent->ext_off;
	if (wnp->noff + numsize != wnp_ext_off) {
		p = (unsigned char *)wnp->isoent->identifier;
		/* Extend the filename; foo.c --> foo___.c */
		memmove(p + wnp->noff + numsize, p + wnp_ext_off,
		    wnp->isoent->ext_len + nullsize);
		wnp->isoent->ext_off = wnp_ext_off = wnp->noff + numsize;
		wnp->isoent->id_len = wnp_ext_off + wnp->isoent->ext_len;
	}
}